

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int flatcc_emitter(void *emit_context,flatcc_iovec_t *iov,int iov_count,flatbuffers_soffset_t offset
                  ,size_t len)

{
  flatcc_iovec_t *pfVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  ulong *puVar6;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  size_t sVar10;
  flatcc_iovec_t *pfVar11;
  bool bVar12;
  
  *(long *)((long)emit_context + 0x30) = *(long *)((long)emit_context + 0x30) + len;
  if (offset < 0) {
    puVar6 = (ulong *)((long)emit_context + 0x18);
    uVar9 = *(ulong *)((long)emit_context + 0x18);
    if (uVar9 < len) {
      pfVar11 = iov + iov_count;
      do {
        bVar12 = iov_count == 0;
        iov_count = iov_count + -1;
        if (bVar12) {
          return 0;
        }
        pfVar1 = pfVar11 + -1;
        sVar10 = pfVar11[-1].iov_len;
        pvVar8 = (void *)((long)pfVar11[-1].iov_base + sVar10);
        for (; pfVar11 = pfVar1, sVar10 != 0; sVar10 = sVar10 - uVar7) {
          uVar9 = *puVar6;
          while ((uVar7 = sVar10, uVar9 < sVar10 && (uVar7 = uVar9, uVar9 == 0))) {
            lVar2 = *emit_context;
            if ((lVar2 == 0) ||
               (pvVar4 = *(void **)(lVar2 + 0xb88), pvVar4 == *(void **)((long)emit_context + 8))) {
              pvVar4 = malloc(0xb98);
              if (pvVar4 == (void *)0x0) {
                return -1;
              }
              *(long *)((long)emit_context + 0x38) = *(long *)((long)emit_context + 0x38) + 0xb80;
              if (lVar2 != 0) {
                lVar3 = *(long *)((long)emit_context + 8);
                *(long *)((long)pvVar4 + 0xb88) = lVar3;
                *(long *)((long)pvVar4 + 0xb80) = lVar2;
                *(void **)(lVar2 + 0xb88) = pvVar4;
                *(void **)(lVar3 + 0xb80) = pvVar4;
                goto LAB_00106d08;
              }
              *(void **)emit_context = pvVar4;
              *(void **)((long)emit_context + 8) = pvVar4;
              *(void **)((long)pvVar4 + 0xb80) = pvVar4;
              *(void **)((long)pvVar4 + 0xb88) = pvVar4;
              uVar9 = 0x5c0;
              *(long *)((long)emit_context + 0x10) = (long)pvVar4 + 0x5c0;
              *(long *)((long)emit_context + 0x20) = (long)pvVar4 + 0x5c0;
              *(undefined8 *)((long)emit_context + 0x18) = 0x5c0;
              *(undefined8 *)((long)emit_context + 0x28) = 0x5c0;
              iVar5 = -0x5c0;
            }
            else {
              *(int *)((long)pvVar4 + 0xb90) = *(int *)(lVar2 + 0xb90) + -0xb80;
LAB_00106d08:
              *(void **)emit_context = pvVar4;
              uVar9 = 0xb80;
              *(long *)((long)emit_context + 0x10) = (long)pvVar4 + 0xb80;
              *(undefined8 *)((long)emit_context + 0x18) = 0xb80;
              iVar5 = *(int *)(*(long *)((long)pvVar4 + 0xb80) + 0xb90) + -0xb80;
            }
            *(int *)((long)pvVar4 + 0xb90) = iVar5;
          }
          pvVar4 = (void *)(*(long *)((long)emit_context + 0x10) - uVar7);
          *(void **)((long)emit_context + 0x10) = pvVar4;
          *(ulong *)((long)emit_context + 0x18) = uVar9 - uVar7;
          pvVar8 = (void *)((long)pvVar8 - uVar7);
          memcpy(pvVar4,pvVar8,uVar7);
        }
      } while( true );
    }
    pvVar8 = (void *)(*(long *)((long)emit_context + 0x10) - len);
    *(void **)((long)emit_context + 0x10) = pvVar8;
  }
  else {
    uVar9 = *(ulong *)((long)emit_context + 0x28);
    if (uVar9 < len) {
      do {
        bVar12 = iov_count == 0;
        iov_count = iov_count + -1;
        if (bVar12) {
          return 0;
        }
        pvVar8 = iov->iov_base;
        for (sVar10 = iov->iov_len; sVar10 != 0; sVar10 = sVar10 - uVar7) {
          while ((uVar7 = sVar10, uVar9 < sVar10 && (uVar7 = uVar9, uVar9 == 0))) {
            lVar2 = *(long *)((long)emit_context + 8);
            if ((lVar2 == 0) || (pvVar4 = *(void **)(lVar2 + 0xb80), pvVar4 == *emit_context)) {
              pvVar4 = malloc(0xb98);
              if (pvVar4 == (void *)0x0) {
                return -1;
              }
              *(long *)((long)emit_context + 0x38) = *(long *)((long)emit_context + 0x38) + 0xb80;
              if (lVar2 != 0) {
                *(long *)((long)pvVar4 + 0xb88) = lVar2;
                lVar3 = *emit_context;
                *(long *)((long)pvVar4 + 0xb80) = lVar3;
                *(void **)(lVar3 + 0xb88) = pvVar4;
                *(void **)(lVar2 + 0xb80) = pvVar4;
                goto LAB_00106b9c;
              }
              *(void **)emit_context = pvVar4;
              *(void **)((long)emit_context + 8) = pvVar4;
              *(void **)((long)pvVar4 + 0xb80) = pvVar4;
              *(void **)((long)pvVar4 + 0xb88) = pvVar4;
              uVar9 = 0x5c0;
              *(long *)((long)emit_context + 0x10) = (long)pvVar4 + 0x5c0;
              *(long *)((long)emit_context + 0x20) = (long)pvVar4 + 0x5c0;
              *(undefined8 *)((long)emit_context + 0x18) = 0x5c0;
              *(undefined8 *)((long)emit_context + 0x28) = 0x5c0;
              iVar5 = -0x5c0;
            }
            else {
LAB_00106b9c:
              *(void **)((long)emit_context + 8) = pvVar4;
              *(void **)((long)emit_context + 0x20) = pvVar4;
              *(undefined8 *)((long)emit_context + 0x28) = 0xb80;
              iVar5 = *(int *)(*(long *)((long)pvVar4 + 0xb88) + 0xb90) + 0xb80;
              uVar9 = 0xb80;
            }
            *(int *)((long)pvVar4 + 0xb90) = iVar5;
          }
          memcpy(*(void **)((long)emit_context + 0x20),pvVar8,uVar7);
          pvVar8 = (void *)((long)pvVar8 + uVar7);
          *(long *)((long)emit_context + 0x20) = *(long *)((long)emit_context + 0x20) + uVar7;
          uVar9 = *(long *)((long)emit_context + 0x28) - uVar7;
          *(ulong *)((long)emit_context + 0x28) = uVar9;
        }
        iov = iov + 1;
      } while( true );
    }
    puVar6 = (ulong *)((long)emit_context + 0x28);
    pvVar8 = *(void **)((long)emit_context + 0x20);
    *(size_t *)((long)emit_context + 0x20) = len + (long)pvVar8;
  }
  *puVar6 = uVar9 - len;
  while (bVar12 = iov_count != 0, iov_count = iov_count + -1, bVar12) {
    memcpy(pvVar8,iov->iov_base,iov->iov_len);
    pvVar8 = (void *)((long)pvVar8 + iov->iov_len);
    iov = iov + 1;
  }
  return 0;
}

Assistant:

int flatcc_emitter(void *emit_context,
        const flatcc_iovec_t *iov, int iov_count,
        flatbuffers_soffset_t offset, size_t len)
{
    flatcc_emitter_t *E = emit_context;
    uint8_t *p;

    E->used += len;
    if (offset < 0) {
        if (len <= E->front_left) {
            E->front_cursor -= len;
            E->front_left -= len;
            p = E->front_cursor;
            goto copy;
        }
        iov += iov_count;
        while (iov_count--) {
            --iov;
            if (copy_front(E, iov->iov_base, iov->iov_len)) {
                return -1;
            }
        }
    } else {
        if (len <= E->back_left) {
            p = E->back_cursor;
            E->back_cursor += len;
            E->back_left -= len;
            goto copy;
        }
        while (iov_count--) {
            if (copy_back(E, iov->iov_base, iov->iov_len)) {
                return -1;
            }
            ++iov;
        }
    }
    return 0;
copy:
    while (iov_count--) {
        memcpy(p, iov->iov_base, iov->iov_len);
        p += iov->iov_len;
        ++iov;
    }
    return 0;
}